

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O0

bool __thiscall
asio::detail::posix_event::
maybe_unlock_and_signal_one<asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  bool bVar1;
  scoped_lock *lock_local;
  posix_event *this_local;
  
  bVar1 = conditionally_enabled_mutex::scoped_lock::locked(lock);
  if (bVar1) {
    this->state_ = this->state_ | 1;
    bVar1 = 1 < this->state_;
    if (bVar1) {
      conditionally_enabled_mutex::scoped_lock::unlock(lock);
      pthread_cond_signal((pthread_cond_t *)this);
    }
    return bVar1;
  }
  __assert_fail("lock.locked()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CWMChapman[P]DHT-Implementation/third_party/asio-1.18.0/include/asio/detail/posix_event.hpp"
                ,0x5a,
                "bool asio::detail::posix_event::maybe_unlock_and_signal_one(Lock &) [Lock = asio::detail::conditionally_enabled_mutex::scoped_lock]"
               );
}

Assistant:

bool maybe_unlock_and_signal_one(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    state_ |= 1;
    if (state_ > 1)
    {
      lock.unlock();
      ::pthread_cond_signal(&cond_); // Ignore EINVAL.
      return true;
    }
    return false;
  }